

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_StoDelete(Of_Man_t *p)

{
  void *__ptr;
  void **__ptr_00;
  int *piVar1;
  Vec_Mem_t *pVVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  iVar3 = (p->vPages).nSize;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      __ptr = (p->vPages).pArray[lVar5];
      if ((void *)0x2 < __ptr) {
        free(__ptr);
        iVar3 = (p->vPages).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  __ptr_00 = (p->vPages).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vPages).pArray = (void **)0x0;
  }
  (p->vPages).nCap = 0;
  (p->vPages).nSize = 0;
  piVar1 = (p->vCutSets).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutSets).pArray = (int *)0x0;
  }
  (p->vCutSets).nCap = 0;
  (p->vCutSets).nSize = 0;
  piVar1 = (p->vCutFlows).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutFlows).pArray = (int *)0x0;
  }
  (p->vCutFlows).nCap = 0;
  (p->vCutFlows).nSize = 0;
  piVar1 = (p->vCutDelays).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutDelays).pArray = (int *)0x0;
  }
  (p->vCutDelays).nCap = 0;
  (p->vCutDelays).nSize = 0;
  piVar1 = (p->vCutRefs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutRefs).pArray = (int *)0x0;
  }
  (p->vCutRefs).nCap = 0;
  (p->vCutRefs).nSize = 0;
  if (p->pObjs != (Of_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Of_Obj_t *)0x0;
  }
  if ((p->pPars->fCutMin == 0) || (pVVar2 = p->vTtMem, pVVar2 == (Vec_Mem_t *)0x0))
  goto LAB_0073bf02;
  pVVar4 = pVVar2->vTable;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar2->vTable->pArray = (int *)0x0;
      pVVar4 = pVVar2->vTable;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0073bec6;
    }
    free(pVVar4);
    pVVar2->vTable = (Vec_Int_t *)0x0;
  }
LAB_0073bec6:
  pVVar4 = pVVar2->vNexts;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar2->vNexts->pArray = (int *)0x0;
      pVVar4 = pVVar2->vNexts;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0073bf02;
    }
    free(pVVar4);
    pVVar2->vNexts = (Vec_Int_t *)0x0;
  }
LAB_0073bf02:
  if (p->pPars->fCutMin != 0) {
    pVVar2 = p->vTtMem;
    iVar3 = pVVar2->iPage;
    if (-1 < iVar3) {
      lVar5 = -1;
      do {
        if (pVVar2->ppPages[lVar5 + 1] != (word *)0x0) {
          free(pVVar2->ppPages[lVar5 + 1]);
          pVVar2->ppPages[lVar5 + 1] = (word *)0x0;
          iVar3 = pVVar2->iPage;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
    }
    if (pVVar2->ppPages != (word **)0x0) {
      free(pVVar2->ppPages);
    }
    free(pVVar2);
    if (p == (Of_Man_t *)0x0) {
      return;
    }
  }
  free(p);
  return;
}

Assistant:

void Of_StoDelete( Of_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    Vec_PtrErase( &p->vPages );
    Vec_IntErase( &p->vCutSets );
    Vec_IntErase( &p->vCutFlows );
    Vec_IntErase( &p->vCutDelays );
    Vec_IntErase( &p->vCutRefs );
    ABC_FREE( p->pObjs );
    // matching
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}